

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O3

void read64(lua_State *L,uint32_t *xx,uint32_t *yy)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  size_t sz;
  size_t local_38;
  
  local_38 = 0;
  puVar1 = (uint32_t *)luaL_checklstring(L,1,&local_38);
  if (local_38 != 8) {
    luaL_error(L,"Invalid uint64 x");
  }
  puVar2 = (uint32_t *)luaL_checklstring(L,2,&local_38);
  if (local_38 != 8) {
    luaL_error(L,"Invalid uint64 y");
  }
  *xx = *puVar1;
  xx[1] = puVar1[1];
  *yy = *puVar2;
  yy[1] = puVar2[1];
  return;
}

Assistant:

static void
read64(lua_State *L, uint32_t xx[2], uint32_t yy[2]) {
	size_t sz = 0;
	const uint8_t *x = (const uint8_t *)luaL_checklstring(L, 1, &sz);
	if (sz != 8) {
		luaL_error(L, "Invalid uint64 x");
	}
	const uint8_t *y = (const uint8_t *)luaL_checklstring(L, 2, &sz);
	if (sz != 8) {
		luaL_error(L, "Invalid uint64 y");
	}
	xx[0] = x[0] | x[1]<<8 | x[2]<<16 | x[3]<<24;
	xx[1] = x[4] | x[5]<<8 | x[6]<<16 | x[7]<<24;
	yy[0] = y[0] | y[1]<<8 | y[2]<<16 | y[3]<<24;
	yy[1] = y[4] | y[5]<<8 | y[6]<<16 | y[7]<<24;
}